

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

bool matchit::impl::
     matchPatternRangeImpl<0ul,0ul,1ul,std::shared_ptr<mathiu::impl::Expr_const>const*&,std::tuple<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::I_const*,bool,mathiu::impl::Infinity_const*,bool,mathiu::impl::Set_const*,bool,mathiu::impl::List_const*,bool,mathiu::impl::PieceWise_const*,bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,mathiu::impl::Pair_const*,bool,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::True_const*,bool,mathiu::impl::False_const*,bool,mathiu::impl::Logical_const*,bool,mathiu::impl::And_const*,bool,mathiu::impl::Logical_const*,bool,mathiu::impl::Or_const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Intersection_const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Difference_const*,bool>>
               (long *rangeBegin,Id<std::shared_ptr<mathiu::impl::Expr_const>> *patternTuple,
               int depth)

{
  bool bVar1;
  
  bVar1 = Id<std::shared_ptr<mathiu::impl::Expr_const>>::
          matchValue<std::shared_ptr<mathiu::impl::Expr_const>const&>
                    (patternTuple + 0x28,(shared_ptr<const_mathiu::impl::Expr> *)*rangeBegin);
  PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::processIdImpl
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)(patternTuple + 0x28),depth + 1,
             (uint)bVar1);
  if (bVar1) {
    bVar1 = Id<std::shared_ptr<mathiu::impl::Expr_const>>::
            matchValue<std::shared_ptr<mathiu::impl::Expr_const>const&>
                      (patternTuple,(shared_ptr<const_mathiu::impl::Expr> *)(*rangeBegin + 0x10));
    PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::processIdImpl
              ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)patternTuple,depth + 1,(uint)bVar1)
    ;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

constexpr decltype(auto) matchPatternRangeImpl(RangeBegin &&rangeBegin,
                                                       PatternTuple &&patternTuple,
                                                       int32_t depth, ContextT &context,
                                                       std::index_sequence<I...>)
        {
            auto const func = [&](auto &&value, auto &&pattern)
            {
                return matchPattern(std::forward<decltype(value)>(value), pattern,
                                    depth + 1, context);
            };
            static_cast<void>(func);
            // Fix Me, avoid call next from begin every time.
            return (func(*std::next(rangeBegin, static_cast<long>(I)),
                         std::get<I + patternStartIdx>(patternTuple)) &&
                    ...);
        }